

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall icu_63::VTimeZone::load(VTimeZone *this,VTZReader *reader,UErrorCode *status)

{
  UVector *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  UnicodeString *pUVar4;
  ulong uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  bool bVar6;
  UnicodeString *local_168;
  UnicodeString *local_148;
  UnicodeString *local_128;
  UnicodeString *local_108;
  UnicodeString *local_e8;
  undefined1 local_d0 [24];
  undefined1 local_b8 [48];
  undefined1 local_88 [22];
  UChar ch;
  UnicodeString line;
  UBool success;
  UBool start;
  UBool eol;
  UErrorCode *status_local;
  VTZReader *reader_local;
  VTimeZone *this_local;
  
  local_128 = (UnicodeString *)reader;
  pUVar4 = (UnicodeString *)UMemory::operator_new((UMemory *)0x28,(size_t)reader);
  local_e8 = (UnicodeString *)0x0;
  if (pUVar4 != (UnicodeString *)0x0) {
    local_128 = (UnicodeString *)uprv_deleteUObject_63;
    UVector::UVector((UVector *)pUVar4,uprv_deleteUObject_63,uhash_compareUnicodeString_63,100,
                     status);
    local_e8 = pUVar4;
  }
  this->vtzlines = (UVector *)local_e8;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 != '\0') {
    return;
  }
  line.fUnion.fStackFields.fBuffer[0x18]._1_1_ = 0;
  line.fUnion.fStackFields.fBuffer[0x18]._0_1_ = 0;
  line.fUnion.fStackFields.fBuffer[0x17]._1_1_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)(local_88 + 0x10));
  __buf = extraout_RDX;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            uVar5 = VTZReader::read(reader,(int)local_128,__buf,(size_t)local_e8);
            local_88._14_2_ = (undefined2)uVar5;
            if (local_88._14_2_ == L'\xffff') {
              local_b8[0x2f] = 0;
              bVar6 = false;
              if (line.fUnion.fStackFields.fBuffer[0x18]._0_1_ != '\0') {
                ConstChar16Ptr::ConstChar16Ptr
                          ((ConstChar16Ptr *)local_88,(char16_t *)ICAL_END_VTIMEZONE);
                local_b8[0x2f] = 1;
                local_128 = (UnicodeString *)local_88;
                UVar2 = UnicodeString::startsWith
                                  ((UnicodeString *)(local_88 + 0x10),(ConstChar16Ptr *)local_128,-1
                                  );
                bVar6 = UVar2 != '\0';
              }
              if ((local_b8[0x2f] & 1) != 0) {
                ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)local_88);
              }
              if (!bVar6) goto LAB_0024314f;
              pUVar1 = this->vtzlines;
              pUVar4 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)local_128);
              local_b8[0x1f] = 0;
              local_108 = (UnicodeString *)0x0;
              if (pUVar4 != (UnicodeString *)0x0) {
                local_b8[0x1f] = 1;
                local_b8._32_8_ = pUVar4;
                UnicodeString::UnicodeString(pUVar4,(UnicodeString *)(local_88 + 0x10));
                local_108 = pUVar4;
              }
              UVector::addElement(pUVar1,local_108,status);
              UVar2 = ::U_FAILURE(*status);
              if (UVar2 != '\0') goto LAB_0024319c;
              line.fUnion.fStackFields.fBuffer[0x17]._1_1_ = 1;
              goto LAB_0024314f;
            }
            __buf = extraout_RDX_00;
          } while (local_88._14_2_ == L'\r');
          if (line.fUnion.fStackFields.fBuffer[0x18]._1_1_ == '\0') break;
          if ((local_88._14_2_ != L'\t') && (local_88._14_2_ != L' ')) {
            if ((line.fUnion.fStackFields.fBuffer[0x18]._0_1_ != '\0') &&
               (iVar3 = UnicodeString::length((UnicodeString *)(local_88 + 0x10)), 0 < iVar3)) {
              pUVar1 = this->vtzlines;
              pUVar4 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)local_128);
              local_b8[0xf] = 0;
              local_128 = (UnicodeString *)0x0;
              local_e8 = pUVar4;
              if (pUVar4 != (UnicodeString *)0x0) {
                local_b8[0xf] = 1;
                local_b8._16_8_ = pUVar4;
                UnicodeString::UnicodeString(pUVar4,(UnicodeString *)(local_88 + 0x10));
                local_128 = pUVar4;
              }
              UVector::addElement(pUVar1,local_128,status);
              UVar2 = ::U_FAILURE(*status);
              if (UVar2 != '\0') goto LAB_0024319c;
            }
            UnicodeString::remove((UnicodeString *)(local_88 + 0x10),(char *)local_128);
            __buf = extraout_RDX_01;
            if (local_88._14_2_ != L'\n') {
              local_128 = (UnicodeString *)(ulong)(ushort)local_88._14_2_;
              UnicodeString::append((UnicodeString *)(local_88 + 0x10),local_88._14_2_);
              __buf = extraout_RDX_02;
            }
          }
          line.fUnion.fStackFields.fBuffer[0x18]._1_1_ = 0;
        }
        if (local_88._14_2_ == L'\n') break;
        local_128 = (UnicodeString *)(uVar5 & 0xffff);
        UnicodeString::append((UnicodeString *)(local_88 + 0x10),local_88._14_2_);
        __buf = extraout_RDX_06;
      }
      line.fUnion.fStackFields.fBuffer[0x18]._1_1_ = 1;
      if (line.fUnion.fStackFields.fBuffer[0x18]._0_1_ != '\0') break;
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)local_d0,(char16_t *)ICAL_BEGIN_VTIMEZONE);
      local_128 = (UnicodeString *)local_d0;
      UVar2 = UnicodeString::startsWith
                        ((UnicodeString *)(local_88 + 0x10),(ConstChar16Ptr *)local_128,-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)local_d0);
      __buf = extraout_RDX_04;
      if (UVar2 != '\0') {
        pUVar1 = this->vtzlines;
        pUVar4 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)local_128);
        local_168 = (UnicodeString *)0x0;
        local_e8 = pUVar4;
        if (pUVar4 != (UnicodeString *)0x0) {
          UnicodeString::UnicodeString(pUVar4,(UnicodeString *)(local_88 + 0x10));
          local_168 = pUVar4;
        }
        UVector::addElement(pUVar1,local_168,status);
        UVar2 = ::U_FAILURE(*status);
        if (UVar2 != '\0') goto LAB_0024319c;
        UnicodeString::remove((UnicodeString *)(local_88 + 0x10),(char *)local_168);
        line.fUnion.fStackFields.fBuffer[0x18]._0_1_ = 1;
        line.fUnion.fStackFields.fBuffer[0x18]._1_1_ = 0;
        __buf = extraout_RDX_05;
        local_128 = local_168;
      }
    }
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)local_b8,(char16_t *)ICAL_END_VTIMEZONE);
    local_128 = (UnicodeString *)local_b8;
    UVar2 = UnicodeString::startsWith
                      ((UnicodeString *)(local_88 + 0x10),(ConstChar16Ptr *)local_128,-1);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)local_b8);
    __buf = extraout_RDX_03;
  } while (UVar2 == '\0');
  pUVar1 = this->vtzlines;
  pUVar4 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)local_128);
  local_d0[0xf] = 0;
  local_148 = (UnicodeString *)0x0;
  if (pUVar4 != (UnicodeString *)0x0) {
    local_d0[0xf] = 1;
    local_d0._16_8_ = pUVar4;
    UnicodeString::UnicodeString(pUVar4,(UnicodeString *)(local_88 + 0x10));
    local_148 = pUVar4;
  }
  UVector::addElement(pUVar1,local_148,status);
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    line.fUnion.fStackFields.fBuffer[0x17]._1_1_ = 1;
LAB_0024314f:
    if (line.fUnion.fStackFields.fBuffer[0x17]._1_1_ != '\0') {
      parse(this,status);
      goto LAB_002431da;
    }
    UVar2 = ::U_SUCCESS(*status);
    if (UVar2 != '\0') {
      *status = U_INVALID_STATE_ERROR;
    }
  }
LAB_0024319c:
  if (this->vtzlines != (UVector *)0x0) {
    (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
  }
  this->vtzlines = (UVector *)0x0;
LAB_002431da:
  UnicodeString::~UnicodeString((UnicodeString *)(local_88 + 0x10));
  return;
}

Assistant:

void
VTimeZone::load(VTZReader& reader, UErrorCode& status) {
    vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, DEFAULT_VTIMEZONE_LINES, status);
    if (U_FAILURE(status)) {
        return;
    }
    UBool eol = FALSE;
    UBool start = FALSE;
    UBool success = FALSE;
    UnicodeString line;

    while (TRUE) {
        UChar ch = reader.read();
        if (ch == 0xFFFF) {
            // end of file
            if (start && line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                vtzlines->addElement(new UnicodeString(line), status);
                if (U_FAILURE(status)) {
                    goto cleanupVtzlines;
                }
                success = TRUE;
            }
            break;
        }
        if (ch == 0x000D) {
            // CR, must be followed by LF according to the definition in RFC2445
            continue;
        }
        if (eol) {
            if (ch != 0x0009 && ch != 0x0020) {
                // NOT followed by TAB/SP -> new line
                if (start) {
                    if (line.length() > 0) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                    }
                }
                line.remove();
                if (ch != 0x000A) {
                    line.append(ch);
                }
            }
            eol = FALSE;
        } else {
            if (ch == 0x000A) {
                // LF
                eol = TRUE;
                if (start) {
                    if (line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        success = TRUE;
                        break;
                    }
                } else {
                    if (line.startsWith(ICAL_BEGIN_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        line.remove();
                        start = TRUE;
                        eol = FALSE;
                    }
                }
            } else {
                line.append(ch);
            }
        }
    }
    if (!success) {
        if (U_SUCCESS(status)) {
            status = U_INVALID_STATE_ERROR;
        }
        goto cleanupVtzlines;
    }
    parse(status);
    return;

cleanupVtzlines:
    delete vtzlines;
    vtzlines = NULL;
}